

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O1

void Eigen::internal::
     nnls_householder_qr_inplace_solve<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,_1,1,0,_1,1>>
               (Matrix<float,__1,__1,_0,__1,__1> *mat,Matrix<float,__1,_1,_0,__1,_1> *hCoeffs,
               Matrix<float,__1,_1,_0,__1,_1> *c,Index *rank)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  float *pfVar5;
  float *pfVar6;
  char *pcVar7;
  Matrix<float,_1,_1,_1,_1,_1> workspace;
  float *local_d8;
  ulong local_d0;
  Matrix<float,__1,_1,_0,__1,_1> *local_c0;
  undefined8 local_b8;
  long local_a8;
  float *local_a0;
  ulong local_98;
  ulong local_90;
  Matrix<float,__1,__1,_0,__1,__1> *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  ulong local_70;
  float *local_68;
  ulong local_60;
  Matrix<float,__1,_1,_0,__1,_1> *local_50;
  undefined8 local_48;
  long local_38;
  undefined1 local_30;
  ulong local_28;
  undefined8 local_20;
  
  uVar1 = (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if (uVar1 != (c->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
  {
    __assert_fail("mat.rows() == c.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                  ,0x122,
                  "void Eigen::internal::nnls_householder_qr_inplace_solve(const MatrixQR &, const HCoeffs &, Dest &, typename MatrixQR::Index &) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, Dest = Eigen::Matrix<float, -1, 1>]"
                 );
  }
  lVar2 = (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  lVar3 = (hCoeffs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar2 != lVar3) {
    __assert_fail("mat.cols() == hCoeffs.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                  ,0x123,
                  "void Eigen::internal::nnls_householder_qr_inplace_solve(const MatrixQR &, const HCoeffs &, Dest &, typename MatrixQR::Index &) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, Dest = Eigen::Matrix<float, -1, 1>]"
                 );
  }
  uVar4 = *rank;
  if (lVar2 < (long)uVar4) {
    __assert_fail("mat.cols() >= rank",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                  ,0x124,
                  "void Eigen::internal::nnls_householder_qr_inplace_solve(const MatrixQR &, const HCoeffs &, Dest &, typename MatrixQR::Index &) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, Dest = Eigen::Matrix<float, -1, 1>]"
                 );
  }
  pfVar5 = (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  if (-1 < (long)(uVar4 | uVar1) || pfVar5 == (float *)0x0) {
    if ((long)(uVar4 | uVar1) < 0) {
      pcVar7 = 
      "Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, -1, true>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = true]"
      ;
    }
    else {
      pfVar6 = (hCoeffs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      if ((long)uVar4 < 0 && pfVar6 != (float *)0x0) {
        pcVar7 = 
        "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<float, -1, 1>, -1, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<float, -1, 1>, -1, 1>, Level = 0]"
        ;
        goto LAB_0017790b;
      }
      if (((long)uVar4 < 0) || (lVar3 < (long)uVar4)) {
        pcVar7 = 
        "Eigen::Block<const Eigen::Matrix<float, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<float, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
        ;
      }
      else {
        local_80 = 0;
        uStack_78 = 0;
        local_28 = uVar1;
        if ((long)uVar4 < (long)uVar1) {
          local_28 = uVar4;
        }
        local_48 = 0;
        local_30 = 1;
        local_20 = 0;
        local_a0 = pfVar5;
        local_98 = uVar1;
        local_90 = uVar4;
        local_88 = mat;
        local_70 = uVar1;
        local_68 = pfVar6;
        local_60 = uVar4;
        local_50 = hCoeffs;
        local_38 = lVar3;
        HouseholderSequence<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,-1,true>,Eigen::VectorBlock<Eigen::Matrix<float,-1,1,0,-1,1>const,-1>,1>
        ::applyThisOnTheLeft<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,1,1,1,1,1>>
                  ((HouseholderSequence<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,true>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>const,_1>,1>
                    *)&local_a0,c,(Matrix<float,_1,_1,_1,_1,_1> *)&local_d8,false);
        uVar1 = *rank;
        pfVar5 = (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data;
        if ((long)uVar1 < 0 && pfVar5 != (float *)0x0) {
          pcVar7 = 
          "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<float, -1, -1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<float, -1, -1>>, Level = 0]"
          ;
          goto LAB_0017790b;
        }
        if ((((long)uVar1 < 0) ||
            (uVar4 = (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                     m_storage.m_rows, (long)uVar4 < (long)uVar1)) ||
           ((mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols
            < (long)uVar1)) {
          pcVar7 = 
          "Eigen::Block<const Eigen::Matrix<float, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
          ;
        }
        else {
          local_80 = 0;
          uStack_78 = 0;
          local_d8 = (c->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data;
          local_a8 = (c->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
                     m_rows;
          local_b8 = 0;
          local_d0 = uVar1;
          local_c0 = c;
          local_a0 = pfVar5;
          local_98 = uVar1;
          local_90 = uVar1;
          local_70 = uVar4;
          if ((long)uVar1 <= local_a8) {
            local_88 = mat;
            TriangularViewImpl<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,-1,false>const,2u,Eigen::Dense>
            ::solveInPlace<1,Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,1,false>>
                      ((TriangularViewImpl<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,false>const,2u,Eigen::Dense>
                        *)&local_a0,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                        *)&local_d8);
            return;
          }
          pcVar7 = 
          "Eigen::Block<Eigen::Matrix<float, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
          ;
          local_88 = mat;
        }
      }
    }
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                  ,0x93,pcVar7);
  }
  pcVar7 = 
  "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, -1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, -1, true>, Level = 0]"
  ;
LAB_0017790b:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,pcVar7);
}

Assistant:

void nnls_householder_qr_inplace_solve(const MatrixQR& mat, const HCoeffs &hCoeffs,
                                       Dest &c, typename MatrixQR::Index &rank)
{
  eigen_assert(mat.rows() == c.size());
  eigen_assert(mat.cols() == hCoeffs.size());
  eigen_assert(mat.cols() >= rank);

  c.applyOnTheLeft(householderSequence(
    mat.leftCols(rank),
    hCoeffs.head(rank)).transpose());

  mat.topLeftCorner(rank, rank)
     .template triangularView<Upper>()
     .solveInPlace(c.head(rank));
}